

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
EncodeConnectivityFromCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex corner_id)

{
  pointer *ppIVar1;
  ulong *puVar2;
  mapped_type mVar3;
  CornerTable *pCVar4;
  _Bit_type *p_Var5;
  iterator iVar6;
  bool bVar7;
  bool bVar8;
  mapped_type *pmVar9;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *pIVar10;
  ulong uVar11;
  uint uVar12;
  iterator iVar13;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *pIVar14;
  int iVar15;
  int iVar16;
  EdgebreakerTopologyBitPattern EVar17;
  ulong uVar18;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar19;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_6c;
  EdgebreakerTopologyBitPattern local_68;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_64;
  vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
  *local_60;
  int local_58;
  int local_54;
  ulong local_50;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_48;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  pIVar10 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar13._M_current =
       (this->corner_traversal_stack_).
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar13._M_current != pIVar10) {
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar10;
    iVar13._M_current = pIVar10;
  }
  local_48 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              *)&this->corner_traversal_stack_;
  if (iVar13._M_current ==
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_6c.value_ = corner_id.value_;
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              (local_48,iVar13,&local_6c);
    pIVar10 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar14 = (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar13._M_current)->value_ = corner_id.value_;
    pIVar14 = iVar13._M_current + 1;
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar14;
  }
  if (pIVar10 != pIVar14) {
    local_54 = (int)((ulong)((long)(this->mesh_->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mesh_->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->processed_connectivity_corners_;
    local_60 = (vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                *)&(this->traversal_encoder_).symbols_;
    local_40 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->face_to_split_symbol_map_;
    do {
      IVar19.value_ = pIVar14[-1].value_;
      if ((IVar19.value_ == 0xffffffff) ||
         ((*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     + (ulong)(IVar19.value_ / 0x18 & 0xfffffff8)) >>
           ((ulong)IVar19.value_ / 3 & 0x3f) & 1) != 0)) {
        pIVar14 = pIVar14 + -1;
LAB_0013a2de:
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar14;
      }
      else {
        iVar15 = local_54;
        if (0 < local_54) {
          do {
            this->last_encoded_symbol_id_ = this->last_encoded_symbol_id_ + 1;
            uVar18 = (ulong)IVar19.value_ / 3;
            if (IVar19.value_ == 0xffffffff) {
              uVar18 = 0xffffffff;
            }
            EVar17 = (EdgebreakerTopologyBitPattern)uVar18;
            puVar2 = (this->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar18 >> 6)
            ;
            *puVar2 = *puVar2 | 1L << ((byte)uVar18 & 0x3f);
            iVar13._M_current =
                 (this->processed_connectivity_corners_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_6c.value_ = IVar19.value_;
            if (iVar13._M_current ==
                (this->processed_connectivity_corners_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                        (local_38,iVar13,&local_6c);
            }
            else {
              (iVar13._M_current)->value_ = IVar19.value_;
              (this->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar13._M_current + 1;
            }
            pCVar4 = (this->corner_table_)._M_t.
                     super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
            if ((ulong)local_6c.value_ == 0xffffffff) {
              uVar18 = 0xffffffff;
            }
            else {
              uVar18 = (ulong)*(uint *)(*(long *)&(pCVar4->corner_to_vertex_map_).vector_ +
                                       (ulong)local_6c.value_ * 4);
            }
            p_Var5 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            iVar16 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar18];
            uVar11 = p_Var5[uVar18 >> 6];
            if (((uVar11 >> (uVar18 & 0x3f) & 1) == 0) &&
               (p_Var5[uVar18 >> 6] = uVar11 | 1L << (uVar18 & 0x3f), iVar16 == -1)) {
              local_68 = TOPOLOGY_C;
              iVar6._M_current =
                   (this->traversal_encoder_).symbols_.
                   super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->traversal_encoder_).symbols_.
                  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                          (local_60,iVar6,&local_68);
              }
              else {
                *iVar6._M_current = TOPOLOGY_C;
                (this->traversal_encoder_).symbols_.
                super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              IVar19.value_ = 0xffffffff;
              if (local_6c.value_ != 0xffffffff) {
                uVar12 = local_6c.value_ - 2;
                if (0x55555555 < (local_6c.value_ + 1) * -0x55555555) {
                  uVar12 = local_6c.value_ + 1;
                }
                if (uVar12 != 0xffffffff) {
                  IVar19.value_ =
                       *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                             .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                            _M_head_impl)->opposite_corners_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                + (ulong)uVar12 * 4);
                }
              }
            }
            else {
              local_58 = iVar16;
              if (local_6c.value_ == 0xffffffff) {
                local_64.value_ = 0xffffffff;
LAB_0013a3ee:
                bVar8 = IsRightFaceVisited(this,(CornerIndex)local_6c.value_);
                bVar7 = IsLeftFaceVisited(this,(CornerIndex)local_6c.value_);
                if (!bVar8) {
                  if (bVar7) goto LAB_0013a527;
                  IVar19.value_ = 0xffffffff;
                  local_50 = uVar18;
LAB_0013a689:
                  local_68 = TOPOLOGY_S;
                  iVar6._M_current =
                       (this->traversal_encoder_).symbols_.
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (this->traversal_encoder_).symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                    ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                              (local_60,iVar6,&local_68);
                  }
                  else {
                    *iVar6._M_current = TOPOLOGY_S;
                    (this->traversal_encoder_).symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
                  }
                  this->num_split_symbols_ = this->num_split_symbols_ + 1;
                  if (local_58 != -1) {
                    iVar15 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[local_50];
                    uVar18 = (ulong)iVar15;
                    iVar16 = iVar15 + 0x3f;
                    if (-1 < (long)uVar18) {
                      iVar16 = iVar15;
                    }
                    if (((this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [(long)(iVar16 >> 6) +
                          (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff] >> (uVar18 & 0x3f) & 1) == 0) {
                      EncodeHole(this,(CornerIndex)local_6c.value_,false);
                    }
                  }
                  mVar3 = this->last_encoded_symbol_id_;
                  local_68 = EVar17;
                  pmVar9 = std::__detail::
                           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[](local_40,(key_type *)&local_68);
                  *pmVar9 = mVar3;
                  iVar13._M_current =
                       (this->corner_traversal_stack_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  iVar13._M_current[-1].value_ = IVar19.value_;
                  if (iVar13._M_current !=
                      (this->corner_traversal_stack_).
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    (iVar13._M_current)->value_ = local_64.value_;
                    pIVar14 = iVar13._M_current + 1;
                    goto LAB_0013a2de;
                  }
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            (local_48,iVar13,&local_64);
                  break;
                }
                IVar19.value_ = 0xffffffff;
                if (bVar7) goto LAB_0013a64c;
              }
              else {
                uVar12 = local_6c.value_ - 2;
                if (0x55555555 < (local_6c.value_ + 1) * -0x55555555) {
                  uVar12 = local_6c.value_ + 1;
                }
                if (uVar12 == 0xffffffff) {
                  uVar11 = 0xffffffff;
                }
                else {
                  uVar11 = (ulong)*(uint *)(*(long *)&(pCVar4->opposite_corners_).vector_.
                                                                                                            
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                           + (ulong)uVar12 * 4);
                }
                local_64.value_ = (uint)uVar11;
                if (local_6c.value_ * -0x55555555 < 0x55555556) {
                  uVar12 = local_6c.value_ + 2;
                  if (uVar12 != 0xffffffff) goto LAB_0013a450;
                  local_50 = uVar18;
                  if (local_64.value_ == 0xffffffff) goto LAB_0013a3ee;
                  iVar16 = (int)(uVar11 / 3);
                  IVar19.value_ = 0xffffffff;
                  uVar12 = 0xffffffff;
                }
                else {
                  uVar12 = local_6c.value_ - 1;
LAB_0013a450:
                  IVar19.value_ =
                       *(uint *)(*(long *)&(pCVar4->opposite_corners_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                + (ulong)uVar12 * 4);
                  iVar16 = (int)(uVar11 / 3);
                  if (local_64.value_ == 0xffffffff) {
                    iVar16 = -1;
                  }
                  uVar12 = IVar19.value_ / 3;
                  if (IVar19.value_ == 0xffffffff) {
                    uVar12 = 0xffffffff;
                  }
                }
                local_50 = uVar18;
                bVar8 = IsRightFaceVisited(this,(CornerIndex)local_6c.value_);
                if (!bVar8) {
                  bVar8 = IsLeftFaceVisited(this,(CornerIndex)local_6c.value_);
                  if (!bVar8) goto LAB_0013a689;
                  if (uVar12 != 0xffffffff) {
                    CheckAndStoreTopologySplitEvent
                              (this,this->last_encoded_symbol_id_,EVar17,LEFT_FACE_EDGE,uVar12);
                  }
LAB_0013a527:
                  local_68 = TOPOLOGY_L;
                  iVar6._M_current =
                       (this->traversal_encoder_).symbols_.
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (this->traversal_encoder_).symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                    ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                              (local_60,iVar6,&local_68);
                    IVar19.value_ = local_64.value_;
                  }
                  else {
                    *iVar6._M_current = TOPOLOGY_L;
                    (this->traversal_encoder_).symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
                    IVar19.value_ = local_64.value_;
                  }
                  goto LAB_0013a577;
                }
                if (iVar16 != -1) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,EVar17,RIGHT_FACE_EDGE,iVar16);
                }
                bVar8 = IsLeftFaceVisited(this,(CornerIndex)local_6c.value_);
                if (bVar8) {
                  if (uVar12 != 0xffffffff) {
                    CheckAndStoreTopologySplitEvent
                              (this,this->last_encoded_symbol_id_,EVar17,LEFT_FACE_EDGE,uVar12);
                  }
LAB_0013a64c:
                  local_68 = TOPOLOGY_E;
                  iVar6._M_current =
                       (this->traversal_encoder_).symbols_.
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar6._M_current ==
                      (this->traversal_encoder_).symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                    ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                              (local_60,iVar6,&local_68);
                  }
                  else {
                    *iVar6._M_current = TOPOLOGY_E;
                    (this->traversal_encoder_).symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
                  }
                  ppIVar1 = &(this->corner_traversal_stack_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + -1;
                  break;
                }
              }
              local_68 = TOPOLOGY_R;
              iVar6._M_current =
                   (this->traversal_encoder_).symbols_.
                   super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->traversal_encoder_).symbols_.
                  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                          (local_60,iVar6,&local_68);
              }
              else {
                *iVar6._M_current = TOPOLOGY_R;
                (this->traversal_encoder_).symbols_.
                super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
            }
LAB_0013a577:
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
      }
      pIVar14 = (this->corner_traversal_stack_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != pIVar14);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivityFromCorner(
    CornerIndex corner_id) {
  corner_traversal_stack_.clear();
  corner_traversal_stack_.push_back(corner_id);
  const int num_faces = mesh_->num_faces();
  while (!corner_traversal_stack_.empty()) {
    // Currently processed corner.
    corner_id = corner_traversal_stack_.back();
    // Make sure the face hasn't been visited yet.
    if (corner_id == kInvalidCornerIndex ||
        visited_faces_[corner_table_->Face(corner_id).value()]) {
      // This face has been already traversed.
      corner_traversal_stack_.pop_back();
      continue;
    }
    int num_visited_faces = 0;
    while (num_visited_faces < num_faces) {
      // Mark the current face as visited.
      ++num_visited_faces;
      ++last_encoded_symbol_id_;

      const FaceIndex face_id = corner_table_->Face(corner_id);
      visited_faces_[face_id.value()] = true;
      processed_connectivity_corners_.push_back(corner_id);
      traversal_encoder_.NewCornerReached(corner_id);
      const VertexIndex vert_id = corner_table_->Vertex(corner_id);
      const bool on_boundary = (vertex_hole_id_[vert_id.value()] != -1);
      if (!IsVertexVisited(vert_id)) {
        // A new unvisited vertex has been reached. We need to store its
        // position difference using next, prev, and opposite vertices.
        visited_vertex_ids_[vert_id.value()] = true;
        if (!on_boundary) {
          // If the vertex is on boundary it must correspond to an unvisited
          // hole and it will be encoded with TOPOLOGY_S symbol later).
          traversal_encoder_.EncodeSymbol(TOPOLOGY_C);
          // Move to the right triangle.
          corner_id = GetRightCorner(corner_id);
          continue;
        }
      }
      // The current vertex has been already visited or it was on a boundary.
      // We need to determine whether we can visit any of it's neighboring
      // faces.
      const CornerIndex right_corner_id = GetRightCorner(corner_id);
      const CornerIndex left_corner_id = GetLeftCorner(corner_id);
      const FaceIndex right_face_id = corner_table_->Face(right_corner_id);
      const FaceIndex left_face_id = corner_table_->Face(left_corner_id);
      if (IsRightFaceVisited(corner_id)) {
        // Right face has been already visited.
        // Check whether there is a topology split event.
        if (right_face_id != kInvalidFaceIndex) {
          CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                          face_id.value(), RIGHT_FACE_EDGE,
                                          right_face_id.value());
        }
        if (IsLeftFaceVisited(corner_id)) {
          // Both neighboring faces are visited. End reached.
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_E);
          corner_traversal_stack_.pop_back();
          break;  // Break from the while (num_visited_faces < num_faces) loop.
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_R);
          // Go to the left face.
          corner_id = left_corner_id;
        }
      } else {
        // Right face was not visited.
        if (IsLeftFaceVisited(corner_id)) {
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_L);
          // Left face visited, go to the right one.
          corner_id = right_corner_id;
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_S);
          ++num_split_symbols_;
          // Both neighboring faces are unvisited, we need to visit both of
          // them.
          if (on_boundary) {
            // The tip vertex is on a hole boundary. If the hole hasn't been
            // visited yet we need to encode it.
            const int hole_id = vertex_hole_id_[vert_id.value()];
            if (!visited_holes_[hole_id]) {
              EncodeHole(corner_id, false);
            }
          }
          face_to_split_symbol_map_[face_id.value()] = last_encoded_symbol_id_;
          // Split the traversal.
          // First make the top of the current corner stack point to the left
          // face (this one will be processed second).
          corner_traversal_stack_.back() = left_corner_id;
          // Add a new corner to the top of the stack (right face needs to
          // be traversed first).
          corner_traversal_stack_.push_back(right_corner_id);
          // Break from the while (num_visited_faces < num_faces) loop.
          break;
        }
      }
    }
  }
  return true;  // All corners have been processed.
}